

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O2

gpt2_batch * gpt2_batch_init(gpt2_batch *__return_storage_ptr__,int32_t n_tokens,int32_t embd)

{
  size_t __size;
  float *pfVar1;
  id *piVar2;
  gpt2_pos *pgVar3;
  gpt2_seq_id *pgVar4;
  int8_t *piVar5;
  
  __return_storage_ptr__->n_tokens = -1;
  __return_storage_ptr__->token = (id *)0x0;
  __return_storage_ptr__->embd = (float *)0x0;
  __size = (long)n_tokens * 4;
  if (embd == 0) {
    piVar2 = (id *)malloc(__size);
    __return_storage_ptr__->token = piVar2;
  }
  else {
    pfVar1 = (float *)malloc((long)embd * __size);
    __return_storage_ptr__->embd = pfVar1;
  }
  pgVar3 = (gpt2_pos *)malloc(__size);
  __return_storage_ptr__->pos = pgVar3;
  pgVar4 = (gpt2_seq_id *)malloc(__size);
  __return_storage_ptr__->seq_id = pgVar4;
  piVar5 = (int8_t *)malloc((long)n_tokens);
  __return_storage_ptr__->logits = piVar5;
  return __return_storage_ptr__;
}

Assistant:

struct gpt2_batch gpt2_batch_init(int32_t n_tokens, int32_t embd) {
    gpt2_batch batch;

    if (embd) {
        batch.embd = (float *) malloc(sizeof(float) * n_tokens * embd);
    } else {
        batch.token = (gpt_vocab::id *) malloc(sizeof(gpt_vocab::id) * n_tokens);
    }

    batch.pos    = (gpt2_pos *)    malloc(sizeof(gpt2_pos)    * n_tokens);
    batch.seq_id = (gpt2_seq_id *) malloc(sizeof(gpt2_seq_id) * n_tokens);
    batch.logits = (int8_t *)      malloc(sizeof(int8_t)      * n_tokens);

    return batch;
}